

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O2

void Search::start(position *p,limits *lims,bool silent)

{
  Score SVar1;
  position *ppVar2;
  pointer pRVar3;
  pointer puVar4;
  bool bVar5;
  ostream *poVar6;
  Move *m;
  Move *m_00;
  unique_ptr<position,_std::default_delete<position>_> *t;
  long lVar7;
  ulong uVar8;
  pointer puVar9;
  Score SVar10;
  Move *m_01;
  bool silent_local;
  U16 depth;
  Rootmoves bestRoots;
  undefined1 local_4d0 [40];
  Threadpool<Workerthread> timer_thread;
  Movegen mvs;
  
  silent_local = silent;
  std::
  vector<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
  ::clear(&mPositions);
  Threadpool<Workerthread>::Threadpool(&timer_thread,1);
  elapsed = 0.0;
  UCI_SIGNALS.stop = false;
  p->nodes_searched = 0;
  p->qnodes_searched = 0;
  Movegen::Movegen(&mvs,p);
  Movegen::generate<(Movetype)14,(Piece)6>(&mvs);
  std::vector<Rootmove,_std::allocator<Rootmove>_>::clear(&p->root_moves);
  m_01 = mvs.list;
  for (lVar7 = 0; lVar7 < mvs.last; lVar7 = lVar7 + 1) {
    bVar5 = position::is_legal(p,m_01);
    if (bVar5) {
      Rootmove::Rootmove((Rootmove *)local_4d0,m_01);
      std::vector<Rootmove,_std::allocator<Rootmove>_>::emplace_back<Rootmove>
                (&p->root_moves,(Rootmove *)local_4d0);
      std::_Vector_base<Move,_std::allocator<Move>_>::~_Vector_base
                ((_Vector_base<Move,_std::allocator<Move>_> *)local_4d0);
    }
    m_01 = m_01 + 1;
  }
  for (uVar8 = 0; uVar8 < SearchThreads.num_threads; uVar8 = uVar8 + 1) {
    std::make_unique<position,position&>((position *)local_4d0);
    std::
    vector<std::unique_ptr<position,std::default_delete<position>>,std::allocator<std::unique_ptr<position,std::default_delete<position>>>>
    ::emplace_back<std::unique_ptr<position,std::default_delete<position>>>
              ((vector<std::unique_ptr<position,std::default_delete<position>>,std::allocator<std::unique_ptr<position,std::default_delete<position>>>>
                *)&mPositions,(unique_ptr<position,_std::default_delete<position>_> *)local_4d0);
    std::unique_ptr<position,_std::default_delete<position>_>::~unique_ptr
              ((unique_ptr<position,_std::default_delete<position>_> *)local_4d0);
    (mPositions.
     super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
     super___uniq_ptr_impl<position,_std::default_delete<position>_>._M_t.
     super__Tuple_impl<0UL,_position_*,_std::default_delete<position>_>.
     super__Head_base<0UL,_position_*,_false>._M_head_impl)->thread_id = (U16)uVar8;
  }
  depth = 0x40;
  if (lims->depth != 0) {
    depth = (U16)lims->depth;
  }
  LOCK();
  searching = 1;
  UNLOCK();
  Threadpool<Workerthread>::enqueue<void(&)(position&,limits&),position&,limits&>
            (&timer_thread,search_timer,p,lims);
  if (1 < SearchThreads.num_threads) {
    for (uVar8 = 1; uVar8 < SearchThreads.num_threads; uVar8 = uVar8 + 1) {
      Threadpool<Searchthread>::
      enqueue<void(&)(position&,unsigned_short,bool),position&,unsigned_short&,bool&>
                (&SearchThreads,iterative_deepening,
                 mPositions.
                 super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
                 super___uniq_ptr_impl<position,_std::default_delete<position>_>._M_t.
                 super__Tuple_impl<0UL,_position_*,_std::default_delete<position>_>.
                 super__Head_base<0UL,_position_*,_false>._M_head_impl,&depth,&silent_local);
    }
  }
  Threadpool<Searchthread>::
  enqueue<void(&)(position&,unsigned_short,bool),position&,unsigned_short&,bool&>
            (&SearchThreads,iterative_deepening,
             ((mPositions.
               super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<position,_std::default_delete<position>_>._M_t.
             super__Tuple_impl<0UL,_position_*,_std::default_delete<position>_>.
             super__Head_base<0UL,_position_*,_false>._M_head_impl,&depth,&silent_local);
  Threadpool<Searchthread>::wait_finished(&SearchThreads);
  puVar4 = mPositions.
           super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  UCI_SIGNALS.stop = true;
  bestRoots.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bestRoots.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  bestRoots.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  SVar10 = ninf;
  for (puVar9 = mPositions.
                super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar4; puVar9 = puVar9 + 1) {
    if (silent_local == false) {
      poVar6 = std::operator<<((ostream *)&std::cout,"id: ");
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,((puVar9->_M_t).
                                  super___uniq_ptr_impl<position,_std::default_delete<position>_>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_position_*,_std::default_delete<position>_>
                                  .super__Head_base<0UL,_position_*,_false>._M_head_impl)->thread_id
                         );
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    ppVar2 = (puVar9->_M_t).super___uniq_ptr_impl<position,_std::default_delete<position>_>._M_t.
             super__Tuple_impl<0UL,_position_*,_std::default_delete<position>_>.
             super__Head_base<0UL,_position_*,_false>._M_head_impl;
    pRVar3 = *(pointer *)
              &(ppVar2->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl;
    if ((*(pointer *)
          ((long)&(ppVar2->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_> + 8)
         != pRVar3) && (SVar1 = pRVar3->score, SVar10 < SVar1)) {
      std::vector<Rootmove,_std::allocator<Rootmove>_>::operator=(&bestRoots,&ppVar2->root_moves);
      SVar10 = SVar1;
    }
  }
  if (bestRoots.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      bestRoots.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<Rootmove,_std::allocator<Rootmove>_>::operator=
              (&bestRoots,
               &(((mPositions.
                   super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<position,_std::default_delete<position>_>._M_t.
                 super__Tuple_impl<0UL,_position_*,_std::default_delete<position>_>.
                 super__Head_base<0UL,_position_*,_false>._M_head_impl)->root_moves);
  }
  if (silent_local == false) {
    poVar6 = std::operator<<((ostream *)&std::cout,"bestmove ");
    uci::move_to_string_abi_cxx11_
              ((string *)local_4d0,
               (uci *)((bestRoots.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
                        super__Vector_impl_data._M_start)->pv).
                      super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                      super__Vector_impl_data._M_start,m);
    std::operator<<(poVar6,(string *)local_4d0);
    std::__cxx11::string::~string((string *)local_4d0);
    if (1 < (ulong)(((long)((bestRoots.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
                             _M_impl.super__Vector_impl_data._M_start)->pv).
                           super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)((bestRoots.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
                            _M_impl.super__Vector_impl_data._M_start)->pv).
                          super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                          super__Vector_impl_data._M_start) / 3)) {
      poVar6 = std::operator<<((ostream *)&std::cout," ponder ");
      uci::move_to_string_abi_cxx11_
                ((string *)local_4d0,
                 (uci *)(((bestRoots.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl
                           .super__Vector_impl_data._M_start)->pv).
                         super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                         super__Vector_impl_data._M_start + 1),m_00);
      std::operator<<(poVar6,(string *)local_4d0);
      std::__cxx11::string::~string((string *)local_4d0);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  LOCK();
  searching = 0;
  UNLOCK();
  if (p->debug_search == true) {
    std::ofstream::close();
  }
  std::vector<Rootmove,_std::allocator<Rootmove>_>::~vector(&bestRoots);
  Movegen::~Movegen(&mvs);
  Threadpool<Workerthread>::~Threadpool(&timer_thread);
  return;
}

Assistant:

void Search::start(position& p, limits& lims, bool silent) {

	mPositions.clear();

	Threadpool<Workerthread> timer_thread(1);

	elapsed = 0;
	UCI_SIGNALS.stop = false;

	p.set_nodes_searched(0);
	p.set_qnodes_searched(0);

	// load the root moves
	Movegen mvs(p);
	mvs.generate<pseudo_legal, pieces>();
	p.root_moves.clear();
	for (int i = 0; i < mvs.size(); ++i) {
		if (!p.is_legal(mvs[i]))
			continue;
		p.root_moves.push_back(Rootmove(mvs[i]));
	}

	for (unsigned i = 0; i < SearchThreads.size(); ++i) {
		mPositions.emplace_back(std::make_unique<position>(p));
		mPositions[i]->set_id(i);
	}

	U16 depth = (lims.depth > 0 ? lims.depth : 64); // maxdepth
	searching = true;

	timer_thread.enqueue(search_timer, p, lims);


	// Launch worker threads
	if (SearchThreads.size() > 1) {
		for (unsigned i = 1; i < SearchThreads.size(); ++i)
			SearchThreads.enqueue(iterative_deepening, *mPositions[i], depth, silent);
	}

	// Launch main thread
	SearchThreads.enqueue(iterative_deepening, *mPositions[0], depth, silent);


	SearchThreads.wait_finished();
	UCI_SIGNALS.stop = true;


	U64 nodes = 0ULL;
	U64 qnodes = 0ULL;
	Rootmoves bestRoots;
	Score max = Score::ninf;
	for (auto& t : mPositions) {
		if (!silent) {
			std::cout << "id: " << t->id() << " " << t->nodes() << " " << t->qnodes() << std::endl;
		}
		nodes += t->nodes();
		qnodes += t->qnodes();

		if (t->root_moves.size() > 0 && t->root_moves[0].score > max) {
			max = t->root_moves[0].score;
			bestRoots = t->root_moves;
		}
	}

	if (bestRoots.size() <= 0)
		bestRoots = mPositions[0]->root_moves;

	if (!silent) {
		std::cout << "bestmove " << uci::move_to_string(bestRoots[0].pv[0]);
		if (bestRoots[0].pv.size() > 1)
			std::cout << " ponder " << uci::move_to_string(bestRoots[0].pv[1]);
		std::cout << std::endl;
	}

	searching = false;

	if (p.debug_search) {
		debug_file.close();
	}
}